

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O3

void dlib::set_all_logging_output_streams(ostream *out_)

{
  node *pnVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  global_data *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mpair *pmVar5;
  auto_mutex M;
  hook_mfp hook;
  auto_mutex local_a0;
  undefined1 local_88 [48];
  string *local_58;
  string local_48;
  
  this = logger::get_global_data();
  local_a0.m = (mutex *)0x0;
  local_a0.rw = (read_write_mutex *)0x0;
  local_a0.r = &this->m;
  rmutex::lock(&this->m,1);
  (this->loggers).bst.at_start_ = true;
  (this->loggers).bst.current_element = (node *)0x0;
  pmVar5 = &(this->loggers).bst.p;
  while( true ) {
    bVar3 = binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>
            ::move_next(&(this->loggers).bst);
    if (!bVar3) break;
    pnVar1 = (this->loggers).bst.current_element;
    pp_Var2 = (this->loggers).bst.p.super_map_pair<dlib::logger_*,_char>._vptr_map_pair;
    (this->loggers).bst.p.d = &pnVar1->d;
    (this->loggers).bst.p.r = &pnVar1->r;
    iVar4 = (*pp_Var2[2])(pmVar5);
    std::ios::rdbuf((streambuf *)
                    (*(long *)CONCAT44(extraout_var,iVar4) + 0x40 +
                    *(long *)(*(long *)(*(long *)CONCAT44(extraout_var,iVar4) + 0x40) + -0x18)));
    pnVar1 = (this->loggers).bst.current_element;
    pp_Var2 = (this->loggers).bst.p.super_map_pair<dlib::logger_*,_char>._vptr_map_pair;
    (this->loggers).bst.p.d = &pnVar1->d;
    (this->loggers).bst.p.r = &pnVar1->r;
    iVar4 = (*pp_Var2[2])(pmVar5);
    mfp_kernel_1_base_class<4UL>::clear
              ((mfp_kernel_1_base_class<4UL> *)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x170));
  }
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  logger::global_data::set_output_stream(this,(string *)local_88,out_);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_);
  }
  local_88._8_8_ = 0;
  local_88._16_4_ = 2;
  local_88._24_8_ = 0;
  local_88._32_8_ = 0;
  local_88._0_8_ = &PTR__mp_base_base_0030ffb0;
  local_58 = (string *)local_88;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  logger::global_data::set_output_hook(this,&local_48,(hook_mfp *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (**(code **)(local_58->_M_dataplus)._M_p)();
  auto_mutex::unlock(&local_a0);
  return;
}

Assistant:

void set_all_logging_output_streams (
        std::ostream& out_
    )
    {
        logger::global_data& gd = logger::get_global_data();
        auto_mutex M(gd.m);
        gd.loggers.reset();
        while (gd.loggers.move_next())
        {
            gd.loggers.element()->out.rdbuf(out_.rdbuf());
            gd.loggers.element()->hook.clear();
        }

        gd.set_output_stream("",out_);

        // set the default hook to be an empty member function pointer
        logger::hook_mfp hook;
        gd.set_output_hook("",hook);
    }